

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildRegPressureAnalysis(IRContext *this)

{
  byte *pbVar1;
  pointer __p;
  IRContext *local_20;
  pointer local_18;
  
  local_20 = this;
  MakeUnique<spvtools::opt::LivenessAnalysis,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  __p = local_18;
  local_18 = (pointer)0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
           *)&this->reg_pressure_,__p);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
                 *)&local_18);
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 2;
  return;
}

Assistant:

void BuildRegPressureAnalysis() {
    reg_pressure_ = MakeUnique<LivenessAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisRegisterPressure;
  }